

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O0

Bip32FormatType __thiscall
cfd::core::KeyFormatData::GetVersionFormatType(KeyFormatData *this,uint32_t version)

{
  initializer_list<const_cfd::core::ExtkeyVersionPair_*> __l;
  const_reference cVar1;
  reference ppEVar2;
  undefined8 uVar3;
  undefined4 in_stack_ffffffffffffff30;
  Bip32FormatType BVar4;
  undefined4 in_stack_ffffffffffffff34;
  CfdError error_code;
  CfdException *this_00;
  allocator local_b1;
  string local_b0 [32];
  Bip32FormatType *local_90;
  Bip32FormatType *type;
  Bip32FormatType *__end2;
  Bip32FormatType *__begin2;
  Bip32FormatType (*__range2) [3];
  undefined1 local_59;
  ExtkeyVersionPair *local_58;
  ExtkeyVersionPair *local_50;
  ExtkeyVersionPair *local_48;
  iterator local_40;
  undefined8 local_38;
  undefined1 local_30 [8];
  vector<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
  cache_list;
  uint32_t version_local;
  KeyFormatData *this_local;
  
  local_58 = &this->bip32_;
  local_50 = &this->bip49_;
  local_48 = &this->bip84_;
  local_40 = &local_58;
  local_38 = 3;
  this_00 = (CfdException *)&local_59;
  cache_list.
  super__Vector_base<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = version;
  ::std::allocator<const_cfd::core::ExtkeyVersionPair_*>::allocator
            ((allocator<const_cfd::core::ExtkeyVersionPair_*> *)this_00);
  __l._M_len = local_38;
  __l._M_array = local_40;
  ::std::
  vector<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
  ::vector((vector<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
            *)local_30,__l,(allocator_type *)this_00);
  ::std::allocator<const_cfd::core::ExtkeyVersionPair_*>::~allocator
            ((allocator<const_cfd::core::ExtkeyVersionPair_*> *)&local_59);
  __begin2 = &kFormatTypeList;
  __end2 = &kFormatTypeList;
  type = (Bip32FormatType *)&LoadCache()::func;
  while( true ) {
    if (__end2 == type) {
      uVar3 = __cxa_allocate_exception(0x30);
      error_code = (CfdError)((ulong)this >> 0x20);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_b0,"unknown version.",&local_b1);
      CfdException::CfdException
                (this_00,error_code,
                 (string *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      __cxa_throw(uVar3,&CfdException::typeinfo,CfdException::~CfdException);
    }
    local_90 = __end2;
    cVar1 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                      (&this->has_format_,(ulong)*__end2);
    in_stack_ffffffffffffff34 = CONCAT13(cVar1,(int3)in_stack_ffffffffffffff34);
    if ((cVar1) &&
       ((ppEVar2 = ::std::
                   vector<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
                   ::operator[]((vector<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
                                 *)local_30,(ulong)*local_90),
        (*ppEVar2)->pubkey_version ==
        cache_list.
        super__Vector_base<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ ||
        (ppEVar2 = ::std::
                   vector<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
                   ::operator[]((vector<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
                                 *)local_30,(ulong)*local_90),
        (*ppEVar2)->privkey_version ==
        cache_list.
        super__Vector_base<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_)))) break;
    __end2 = __end2 + 1;
  }
  BVar4 = *local_90;
  ::std::
  vector<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
  ::~vector((vector<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
             *)local_30);
  return BVar4;
}

Assistant:

Bip32FormatType KeyFormatData::GetVersionFormatType(uint32_t version) const {
  std::vector<const ExtkeyVersionPair *> cache_list = {
      &bip32_, &bip49_, &bip84_};
  for (const auto &type : kFormatTypeList) {
    if (has_format_[type]) {
      if ((cache_list[type]->pubkey_version == version) ||
          (cache_list[type]->privkey_version == version)) {
        return type;
      }
    }
  }
  throw CfdException(CfdError::kCfdIllegalArgumentError, "unknown version.");
}